

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O2

void __thiscall TPZIntPrism3D::SetOrder(TPZIntPrism3D *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  int iVar2;
  int type_00;
  TPZManVector<int,_2> prc2;
  TPZManVector<int,_2> prc1;
  
  piVar1 = ord->fStore;
  this->fOrdKsi = *piVar1;
  iVar2 = piVar1[2];
  if (piVar1[2] < piVar1[1]) {
    iVar2 = piVar1[1];
  }
  this->fOrdKti = iVar2;
  TPZManVector<int,_2>::TPZManVector(&prc1,1);
  TPZManVector<int,_2>::TPZManVector(&prc2,2);
  piVar1 = ord->fStore;
  *prc1.super_TPZVec<int>.fStore = *piVar1;
  *prc2.super_TPZVec<int>.fStore = piVar1[1];
  prc2.super_TPZVec<int>.fStore[1] = piVar1[2];
  TPZInt1d::SetOrder(&this->fIntRule1D,&prc1.super_TPZVec<int>,type);
  TPZIntTriang::SetOrder(&this->fIntTriang,&prc2.super_TPZVec<int>,type_00);
  *prc1.super_TPZVec<int>.fStore = (this->fIntRule1D).fOrdKsi;
  iVar2 = (this->fIntTriang).fOrdKsi;
  *prc2.super_TPZVec<int>.fStore = iVar2;
  prc2.super_TPZVec<int>.fStore[1] = iVar2;
  this->fOrdKsi = *prc1.super_TPZVec<int>.fStore;
  this->fOrdKti = *prc2.super_TPZVec<int>.fStore;
  TPZManVector<int,_2>::~TPZManVector(&prc2);
  TPZManVector<int,_2>::~TPZManVector(&prc1);
  return;
}

Assistant:

void TPZIntPrism3D::SetOrder(TPZVec<int> &ord,int type) {	
	fOrdKsi = ord[0];   //ordem na reta : zeta
	fOrdKti = (ord[1] > ord[2]) ? ord[1] : ord[2];   //ordem no plano XY
	TPZManVector<int,2> prc1(1),prc2(2);
	prc1[0] = ord[0];
	prc2[0] = ord[1];
	prc2[1] = ord[2];
	fIntRule1D.SetOrder(prc1,type);
	fIntTriang.SetOrder(prc2);
    fIntRule1D.GetOrder(prc1);
    fIntTriang.GetOrder(prc2);
    fOrdKsi = prc1[0];
    fOrdKti = prc2[0];
}